

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_pivot.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalPivot::LogicalPivot
          (LogicalPivot *this,idx_t pivot_idx,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan,BoundPivotInfo *info_p)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_PIVOT);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalPivot_0278fb28;
  this->pivot_index = pivot_idx;
  BoundPivotInfo::BoundPivotInfo(&this->bound_pivot,info_p);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)&(this->super_LogicalOperator).children,plan);
  return;
}

Assistant:

LogicalPivot::LogicalPivot(idx_t pivot_idx, unique_ptr<LogicalOperator> plan, BoundPivotInfo info_p)
    : LogicalOperator(LogicalOperatorType::LOGICAL_PIVOT), pivot_index(pivot_idx), bound_pivot(std::move(info_p)) {
	D_ASSERT(plan);
	children.push_back(std::move(plan));
}